

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

void __thiscall ON_SubDFaceNeighborhood::~ON_SubDFaceNeighborhood(ON_SubDFaceNeighborhood *this)

{
  ON_SubDFaceNeighborhood *this_local;
  
  ReserveCapacity(this,(ON_SubDFace *)0x0);
  ON_SubD_FixedSizeHeap::~ON_SubD_FixedSizeHeap(&this->m_fsh);
  return;
}

Assistant:

ON_SubDFaceNeighborhood::~ON_SubDFaceNeighborhood()
{
  ReserveCapacity(nullptr);
}